

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTree.cpp
# Opt level: O1

void __thiscall DTree::extendDTree(DTree *this,DTreeNode *node)

{
  iterator __position;
  DTreeNode *node_00;
  int *piVar1;
  ulong uVar2;
  DTreeNode **ppDVar3;
  long lVar4;
  
  __position._M_current =
       (node->_schema).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
       ._M_finish;
  if (__position._M_current ==
      (node->_schema).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&node->_schema,__position,&node->_id);
  }
  else {
    *__position._M_current = node->_id;
    (node->_schema).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = __position._M_current + 1;
  }
  uVar2 = 0xffffffffffffffff;
  if (-2 < (long)node->_numOfChildren) {
    uVar2 = (long)node->_numOfChildren * 4 + 4;
  }
  piVar1 = (int *)operator_new__(uVar2);
  node->_childrenIDs = piVar1;
  if (0 < node->_numOfChildren) {
    ppDVar3 = &node->_firstChild;
    lVar4 = 0;
    do {
      node_00 = *ppDVar3;
      extendDTree(this,node_00);
      std::vector<int,std::allocator<int>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                ((vector<int,std::allocator<int>> *)&node->_schema,
                 (node->_schema).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish,
                 (node_00->_schema).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 (node_00->_schema).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      node->_childrenIDs[lVar4] = node_00->_id;
      ppDVar3 = &node_00->_next;
      lVar4 = lVar4 + 1;
    } while (lVar4 < node->_numOfChildren);
  }
  return;
}

Assistant:

void DTree::extendDTree(DTreeNode* node)
{
	node->_schema.push_back(node->_id);
	node->_childrenIDs = new int[node->_numOfChildren + 1];

	/* Copy the schema from all children up. */
	DTreeNode* child = node->_firstChild;
	for (int i = 0; i < node->_numOfChildren; ++i)
	{
		extendDTree(child);
		node->_schema.insert(node->_schema.end(), child->_schema.begin(),
				child->_schema.end());
		node->_childrenIDs[i] = child->_id;
		child = child->_next;
	}
}